

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_push_custom(nk_command_buffer *b,nk_rect r,nk_command_custom_callback cb,nk_handle usr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  float fVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  float fStack_30;
  float fStack_2c;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2367,
                  "void nk_push_custom(struct nk_command_buffer *, struct nk_rect, nk_command_custom_callback, nk_handle)"
                 );
  }
  fVar5 = r.x;
  fVar8 = r.y;
  if (b->use_clipping != 0) {
    fVar1 = (b->clip).w;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      return;
    }
    fVar2 = (b->clip).h;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      return;
    }
    fVar3 = (b->clip).x;
    if (fVar5 + r.w < fVar3) {
      return;
    }
    if (fVar1 + fVar3 < fVar5) {
      return;
    }
    fVar1 = (b->clip).y;
    if (fVar8 + r.h < fVar1) {
      return;
    }
    if (fVar2 + fVar1 < fVar8) {
      return;
    }
  }
  pvVar4 = nk_command_buffer_push(b,NK_COMMAND_CUSTOM,0x28);
  fStack_30 = r.x;
  fStack_2c = r.y;
  auVar9._8_8_ = r._8_8_;
  auVar9._0_8_ = r._8_8_;
  if (pvVar4 != (void *)0x0) {
    auVar6._0_4_ = (int)fVar5;
    auVar6._4_4_ = (int)fVar8;
    auVar6._8_4_ = (int)fStack_30;
    auVar6._12_4_ = (int)fStack_2c;
    auVar6 = pshuflw(auVar6,auVar6,0xe8);
    *(int *)((long)pvVar4 + 0x10) = auVar6._0_4_;
    auVar9 = maxps(auVar9,(undefined1  [16])0x0);
    auVar7._0_4_ = (int)auVar9._0_4_;
    auVar7._4_4_ = (int)auVar9._4_4_;
    auVar7._8_4_ = (int)auVar9._8_4_;
    auVar7._12_4_ = (int)auVar9._12_4_;
    auVar9 = pshuflw(auVar7,auVar7,0xe8);
    *(int *)((long)pvVar4 + 0x14) = auVar9._0_4_;
    *(nk_handle *)((long)pvVar4 + 0x18) = usr;
    *(nk_command_custom_callback *)((long)pvVar4 + 0x20) = cb;
  }
  return;
}

Assistant:

NK_API void
nk_push_custom(struct nk_command_buffer *b, struct nk_rect r,
    nk_command_custom_callback cb, nk_handle usr)
{
    struct nk_command_custom *cmd;
    NK_ASSERT(b);
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    cmd = (struct nk_command_custom*)
        nk_command_buffer_push(b, NK_COMMAND_CUSTOM, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
    cmd->callback_data = usr;
    cmd->callback = cb;
}